

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_psbt.cpp
# Opt level: O2

vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> * __thiscall
cfd::Psbt::GetUtxoDataAll
          (vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *__return_storage_ptr__,Psbt *this,
          NetType net_type)

{
  uint32_t uVar1;
  bool bVar2;
  uint32_t index;
  UtxoData local_520;
  
  (__return_storage_ptr__->super__Vector_base<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bVar2 = HasAllUtxos(this);
  if (bVar2) {
    uVar1 = *(uint32_t *)((long)(this->super_Psbt).wally_psbt_pointer_ + 0x18);
    for (index = 0; uVar1 != index; index = index + 1) {
      GetUtxoData(&local_520,this,index,net_type);
      std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::emplace_back<cfd::UtxoData>
                (__return_storage_ptr__,&local_520);
      UtxoData::~UtxoData(&local_520);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<UtxoData> Psbt::GetUtxoDataAll(NetType net_type) const {
  std::vector<UtxoData> list;
  if (!HasAllUtxos()) return list;

  struct wally_psbt* psbt_pointer;
  psbt_pointer = static_cast<struct wally_psbt*>(wally_psbt_pointer_);
  uint32_t max = static_cast<uint32_t>(psbt_pointer->num_inputs);
  for (uint32_t index = 0; index < max; ++index) {
    list.emplace_back(GetUtxoData(index, net_type));
  }
  return list;
}